

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O2

ostream * operator<<(ostream *os,ipv4_endpoint *endpoint)

{
  char *pcVar1;
  ostream *poVar2;
  
  pcVar1 = inet_ntoa((in_addr)endpoint->addr_net);
  poVar2 = std::operator<<(os,pcVar1);
  poVar2 = std::operator<<(poVar2,':');
  std::ostream::operator<<(poVar2,endpoint->port_net << 8 | endpoint->port_net >> 8);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, ipv4_endpoint const& endpoint)
{
    in_addr tmp{};
    tmp.s_addr = endpoint.addr_net;
    os << inet_ntoa(tmp) << ':' << endpoint.port();
    return os;
}